

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O0

void visitor_suite::test_const_void_with_int(void)

{
  int local_30 [5];
  allocator_type local_19;
  undefined1 local_18 [8];
  storage_type data;
  
  std::allocator<char>::allocator();
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  small_union<bool>((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18,
                    true,&local_19);
  std::allocator<char>::~allocator(&local_19);
  local_30[0] = 0x2a;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void_with_int,void,int>
            ((small_union<std::allocator<char>,int,unsigned_long,bool,int> *)local_18,local_30);
  trial::dynamic::detail::small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int>::
  ~small_union((small_union<std::allocator<char>,_int,_unsigned_long,_bool,_int> *)local_18);
  return;
}

Assistant:

void test_const_void_with_int()
{
    storage_type data{true};
    data.call<const_visitor_void_with_int, void>(42);
}